

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint __thiscall
cimg_library::CImg<unsigned_int>::_atXYZC(CImg<unsigned_int> *this,int x,int y,int z,int c)

{
  int iVar1;
  uint *puVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  CImg<unsigned_int> *in_RDI;
  uint in_R8D;
  uint local_5c;
  uint local_54;
  uint local_4c;
  uint local_44;
  uint local_3c;
  uint local_34;
  uint local_2c;
  uint local_24;
  
  if ((int)in_ESI < 0) {
    local_24 = 0;
  }
  else {
    iVar1 = width(in_RDI);
    local_2c = in_ESI;
    if (iVar1 <= (int)in_ESI) {
      iVar1 = width(in_RDI);
      local_2c = iVar1 - 1;
    }
    local_24 = local_2c;
  }
  if ((int)in_EDX < 0) {
    local_34 = 0;
  }
  else {
    iVar1 = height(in_RDI);
    local_3c = in_EDX;
    if (iVar1 <= (int)in_EDX) {
      iVar1 = height(in_RDI);
      local_3c = iVar1 - 1;
    }
    local_34 = local_3c;
  }
  if ((int)in_ECX < 0) {
    local_44 = 0;
  }
  else {
    iVar1 = depth(in_RDI);
    local_4c = in_ECX;
    if (iVar1 <= (int)in_ECX) {
      iVar1 = depth(in_RDI);
      local_4c = iVar1 - 1;
    }
    local_44 = local_4c;
  }
  if ((int)in_R8D < 0) {
    local_54 = 0;
  }
  else {
    iVar1 = spectrum(in_RDI);
    local_5c = in_R8D;
    if (iVar1 <= (int)in_R8D) {
      iVar1 = spectrum(in_RDI);
      local_5c = iVar1 - 1;
    }
    local_54 = local_5c;
  }
  puVar2 = operator()(in_RDI,local_24,local_34,local_44,local_54);
  return *puVar2;
}

Assistant:

T _atXYZC(const int x, const int y, const int z, const int c) const {
      return (*this)(x<0?0:(x>=width()?width()-1:x), y<0?0:(y>=height()?height()-1:y),
                     z<0?0:(z>=depth()?depth()-1:z), c<0?0:(c>=spectrum()?spectrum()-1:c));
    }